

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

bool active_if_clipboard_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  undefined1 local_30 [8];
  Am_Value_List clipboard_value;
  Am_Object clipboard;
  Am_Object *self_local;
  
  Am_Object::Am_Object((Am_Object *)&clipboard_value.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30);
  pAVar2 = Am_Object::Get(self,0x19d,0);
  Am_Object::operator=((Am_Object *)&clipboard_value.item,pAVar2);
  bVar1 = Am_Object::Valid((Am_Object *)&clipboard_value.item);
  if (!bVar1) {
    Am_Object::operator=((Am_Object *)&clipboard_value.item,&Am_Global_Clipboard);
  }
  bVar1 = Am_Object::Valid((Am_Object *)&clipboard_value.item);
  if (bVar1) {
    pAVar2 = Am_Object::Get((Am_Object *)&clipboard_value.item,0x169,0);
    Am_Value_List::operator=((Am_Value_List *)local_30,pAVar2);
    bVar1 = Am_Value_List::Empty((Am_Value_List *)local_30);
    self_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    self_local._7_1_ = false;
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  Am_Object::~Am_Object((Am_Object *)&clipboard_value.item);
  return self_local._7_1_;
}

Assistant:

Am_Define_Formula(bool, active_if_clipboard)
{
  Am_Object clipboard;
  Am_Value_List clipboard_value;
  clipboard = self.Get(Am_CLIPBOARD);
  if (!clipboard.Valid())
    clipboard = Am_Global_Clipboard;
  if (clipboard.Valid()) {
    clipboard_value = clipboard.Get(Am_VALUE);
    return (!clipboard_value.Empty());
  } else
    return false;
}